

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDumpEquiv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName_00;
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_60;
  uint local_5c;
  int fVerbose;
  int fByName;
  int nConfs;
  int c;
  char *pFileNameOut;
  char *pFileName [2];
  Abc_Ntk_t *pNtks [2];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  memset(pFileName + 1,0,0x10);
  fVerbose = 1000;
  local_5c = 1;
  local_60 = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Cnvh");
      if (iVar1 == -1) {
        if (argc == globalUtilOptind + 3) {
          pFileName[0] = argv[globalUtilOptind + 1];
          pcVar3 = argv[globalUtilOptind + 2];
          fByName = 0;
          while( true ) {
            if (1 < fByName) {
              Abc_NtkDumpEquiv((Abc_Ntk_t **)(pFileName + 1),pcVar3,fVerbose,local_5c,local_60);
              Abc_NtkDelete((Abc_Ntk_t *)pFileName[1]);
              Abc_NtkDelete(pNtks[0]);
              return 0;
            }
            pFileName_00 = pFileName[(long)fByName + -1];
            FileType = Io_ReadFileType(pFileName[(long)fByName + -1]);
            pAVar2 = Io_Read(pFileName_00,FileType,1,0);
            pFileName[(long)fByName + 1] = (char *)pAVar2;
            if (pFileName[(long)fByName + 1] == (char *)0x0) break;
            Abc_NtkToAig((Abc_Ntk_t *)pFileName[(long)fByName + 1]);
            fByName = fByName + 1;
          }
        }
        else {
          Abc_Print(-1,"Expecting three file names on the command line.\n");
        }
        goto LAB_0027ef0d;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x68) goto LAB_0027ef0d;
      if (iVar1 == 0x6e) {
        local_5c = local_5c ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0027ef0d;
        local_60 = local_60 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < fVerbose);
LAB_0027ef0d:
  Abc_Print(-2,"usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n"
           );
  Abc_Print(-2,"\t          computes equivalence classes of nodes in <file1> and <file2>\n");
  Abc_Print(-2,
            "\t          By default this procedure performs matching of primary inputs by name.\n");
  Abc_Print(-2,"\t          Those inputs that cannot be matched are treated as free variables.\n");
  Abc_Print(-2,"\t          There is no effort to match primary outputs. Indeed, if two outputs\n");
  Abc_Print(-2,
            "\t          are equivalent, they will belong to the same equivalence class in the end.\n"
           );
  Abc_Print(-2,"\t-C num  : the maximum number of conflicts at each node [default = %d]\n",
            (ulong)(uint)fVerbose);
  pcVar3 = "no";
  if (local_5c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-n      : enable matching of primary inputs by name [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_60 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v      : prints verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  Abc_Print(-2,"\t<file1> : first network whose nodes are considered\n");
  Abc_Print(-2,"\t<file2> : second network whose nodes are considered\n");
  Abc_Print(-2,"\t<file_dump_equiv> : text file with node equivalence classes\n");
  return 1;
}

Assistant:

int Abc_CommandDumpEquiv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpEquiv( Abc_Ntk_t * pNtks[2], char * pFileName, int nConfs, int fByName, int fVerbose );
    Abc_Ntk_t * pNtks[2] = {NULL};
    char * pFileName[2], * pFileNameOut;
    int c, nConfs = 1000, fByName = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'n':
            fByName ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 3 )
    {
        Abc_Print( -1, "Expecting three file names on the command line.\n" );
        goto usage;
    }
    pFileName[0] = argv[globalUtilOptind];
    pFileName[1] = argv[globalUtilOptind+1];
    pFileNameOut = argv[globalUtilOptind+2];
    for ( c = 0; c < 2; c++ )
    {
        pNtks[c] = Io_Read( pFileName[c], Io_ReadFileType(pFileName[c]), 1, 0 );
        if ( pNtks[c] == NULL )
            goto usage;
        Abc_NtkToAig( pNtks[c] );
    }
//    if ( Abc_NtkCiNum(pNtks[0]) != Abc_NtkCiNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary inputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else if ( Abc_NtkCoNum(pNtks[0]) != Abc_NtkCoNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary outputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else
        Abc_NtkDumpEquiv( pNtks, pFileNameOut, nConfs, fByName, fVerbose );
    Abc_NtkDelete( pNtks[0] );
    Abc_NtkDelete( pNtks[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n" );
    Abc_Print( -2, "\t          computes equivalence classes of nodes in <file1> and <file2>\n" );
    Abc_Print( -2, "\t          By default this procedure performs matching of primary inputs by name.\n" );
    Abc_Print( -2, "\t          Those inputs that cannot be matched are treated as free variables.\n" );
    Abc_Print( -2, "\t          There is no effort to match primary outputs. Indeed, if two outputs\n" );
    Abc_Print( -2, "\t          are equivalent, they will belong to the same equivalence class in the end.\n" );
    Abc_Print( -2, "\t-C num  : the maximum number of conflicts at each node [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-n      : enable matching of primary inputs by name [default = %s]\n", fByName? "yes": "no" );
    Abc_Print( -2, "\t-v      : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file1> : first network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file2> : second network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file_dump_equiv> : text file with node equivalence classes\n" );
    return 1;
}